

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::
Section9InvalidRequireExplicitPolicyTest5<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section9InvalidRequireExplicitPolicyTest5<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.9.5";
  local_88.should_validate = false;
  PkitsTestInfo::SetUserConstrainedPolicySet(&local_88,"");
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<6ul,5ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3f4b62_006ba160,(char *(*) [6])&PTR_anon_var_dwarf_3f4b94_006ba190,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest09RequireExplicitPolicy,
                     Section9InvalidRequireExplicitPolicyTest5) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "requireExplicitPolicy7CACert",
                               "requireExplicitPolicy7subCARE2Cert",
                               "requireExplicitPolicy7subsubCARE2RE4Cert",
                               "requireExplicitPolicy7subsubsubCARE2RE4Cert",
                               "InvalidrequireExplicitPolicyTest5EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "requireExplicitPolicy7CACRL",
                              "requireExplicitPolicy7subCARE2CRL",
                              "requireExplicitPolicy7subsubCARE2RE4CRL",
                              "requireExplicitPolicy7subsubsubCARE2RE4CRL"};
  PkitsTestInfo info;
  info.test_number = "4.9.5";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}